

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O0

void helics::helicsGetVector(string_view val,vector<double,_std::allocator<double>_> *data)

{
  string_view V;
  string_view trimCharacters;
  string_view val_00;
  string_view val_01;
  bool bVar1;
  int iVar2;
  const_reference pvVar3;
  reference pvVar4;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RDI;
  double dVar5;
  complex<double> cval;
  complex<double> vectorVal_1;
  size_type nextChar_1;
  int ii_1;
  size_type firstBracket_1;
  int size_1;
  double vectorVal;
  basic_string_view<char,_std::char_traits<char>_> in_stack_000000c8;
  basic_string_view<char,_std::char_traits<char>_> vstr;
  size_type nextChar;
  int ii;
  size_type firstBracket;
  int size;
  value_type_conflict6 *in_stack_fffffffffffffed8;
  char __c;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffee0;
  value_type_conflict6 *in_stack_fffffffffffffee8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffef0;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffef8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff00;
  size_type in_stack_ffffffffffffff08;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff10;
  double in_stack_ffffffffffffff18;
  size_t in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  string_view *in_stack_ffffffffffffff30;
  size_t in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  int local_a4;
  int local_3c;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  local_10._M_len = (size_t)in_RDI;
  bVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_10);
  if (bVar1) {
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff00,
               (size_type)in_stack_fffffffffffffef8);
  }
  else {
    pvVar3 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::front(&local_10);
    if ((*pvVar3 == 'v') ||
       (pvVar3 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::front(&local_10),
       *pvVar3 == '[')) {
      __c = (char)((ulong)in_stack_fffffffffffffed8 >> 0x38);
      val_00._M_str = in_stack_ffffffffffffff48;
      val_00._M_len = (size_t)in_stack_ffffffffffffff40;
      iVar2 = readSize(val_00);
      if (0 < iVar2) {
        std::vector<double,_std::allocator<double>_>::reserve
                  (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      }
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff00,
                 (size_type)in_stack_fffffffffffffef8);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                (in_stack_fffffffffffffee0,__c,0x434c18);
      for (local_3c = 0; local_3c < iVar2; local_3c = local_3c + 1) {
        std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                  (in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8,
                   (size_type)in_stack_fffffffffffffef0);
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff00,
                   (size_type)in_stack_fffffffffffffef8,(size_type)in_stack_fffffffffffffef0);
        trimCharacters._M_str = in_stack_ffffffffffffff40;
        trimCharacters._M_len = in_stack_ffffffffffffff38;
        gmlc::utilities::string_viewOps::trimString(in_stack_ffffffffffffff30,trimCharacters);
        invalidValue<double>();
        V._M_str = in_stack_ffffffffffffff28;
        V._M_len = in_stack_ffffffffffffff20;
        gmlc::utilities::numeric_conversion<double>(V,in_stack_ffffffffffffff18);
        std::vector<double,_std::allocator<double>_>::push_back
                  (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      }
    }
    else {
      pvVar3 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::front(&local_10);
      if (*pvVar3 == 'c') {
        val_01._M_str = in_stack_ffffffffffffff48;
        val_01._M_len = (size_t)in_stack_ffffffffffffff40;
        iVar2 = readSize(val_01);
        std::vector<double,_std::allocator<double>_>::reserve
                  (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        std::vector<double,_std::allocator<double>_>::resize
                  ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff00,
                   (size_type)in_stack_fffffffffffffef8);
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                  (in_stack_fffffffffffffee0,(char)((ulong)in_stack_fffffffffffffed8 >> 0x38),
                   0x434df6);
        for (local_a4 = 0; local_a4 < iVar2; local_a4 = local_a4 + 1) {
          std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                    (in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8,
                     (size_type)in_stack_fffffffffffffef0);
          CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff00,
                     (size_type)in_stack_fffffffffffffef8,(size_type)in_stack_fffffffffffffef0);
          helicsGetComplex(in_stack_000000c8);
          in_stack_fffffffffffffef0 = in_RDX;
          std::complex<double>::real_abi_cxx11_((complex<double> *)&stack0xffffffffffffff40);
          std::vector<double,_std::allocator<double>_>::push_back
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffee0,
                     in_stack_fffffffffffffed8);
          in_stack_fffffffffffffef8 = in_RDX;
          std::complex<double>::imag_abi_cxx11_((complex<double> *)&stack0xffffffffffffff40);
          std::vector<double,_std::allocator<double>_>::push_back
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffee0,
                     in_stack_fffffffffffffed8);
        }
      }
      else {
        helicsGetComplex(in_stack_000000c8);
        dVar5 = std::complex<double>::imag_abi_cxx11_((complex<double> *)&stack0xffffffffffffff10);
        if ((dVar5 != 0.0) || (NAN(dVar5))) {
          std::vector<double,_std::allocator<double>_>::resize
                    ((vector<double,_std::allocator<double>_> *)local_10._M_len,
                     (size_type)in_stack_fffffffffffffef8);
          dVar5 = std::complex<double>::real_abi_cxx11_((complex<double> *)&stack0xffffffffffffff10)
          ;
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,0);
          *pvVar4 = dVar5;
          dVar5 = std::complex<double>::imag_abi_cxx11_((complex<double> *)&stack0xffffffffffffff10)
          ;
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,1);
          *pvVar4 = dVar5;
        }
        else {
          std::vector<double,_std::allocator<double>_>::resize
                    ((vector<double,_std::allocator<double>_> *)local_10._M_len,
                     (size_type)in_stack_fffffffffffffef8);
          dVar5 = std::complex<double>::real_abi_cxx11_((complex<double> *)&stack0xffffffffffffff10)
          ;
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,0);
          *pvVar4 = dVar5;
        }
      }
    }
  }
  return;
}

Assistant:

void helicsGetVector(std::string_view val, std::vector<double>& data)
{
    if (val.empty()) {
        data.resize(0);
        return;
    }
    if (val.front() == 'v' || val.front() == '[') {
        auto size = readSize(val);
        if (size > 0) {
            data.reserve(size);
        }
        data.resize(0);
        auto firstBracket = val.find_first_of('[');
        for (decltype(size) ii = 0; ii < size; ++ii) {
            auto nextChar = val.find_first_of(";,]", firstBracket + 1);

            auto vstr = val.substr(firstBracket + 1, nextChar - firstBracket - 1);
            string_viewOps::trimString(vstr);
            auto vectorVal = numeric_conversion<double>(vstr, invalidValue<double>());
            data.push_back(vectorVal);

            firstBracket = nextChar;
        }
    } else if (val.front() == 'c') {
        auto size = readSize(val);
        data.reserve(static_cast<std::size_t>(size) * 2);
        data.resize(0);
        auto firstBracket = val.find_first_of('[');
        for (decltype(size) ii = 0; ii < size; ++ii) {
            auto nextChar = val.find_first_of(",;]", firstBracket + 1);
            auto vectorVal =
                helicsGetComplex(val.substr(firstBracket + 1, nextChar - firstBracket - 1));
            data.push_back(vectorVal.real());
            data.push_back(vectorVal.imag());
            firstBracket = nextChar;
        }
    } else {
        auto cval = helicsGetComplex(val);
        if (cval.imag() == 0) {
            data.resize(1);
            data[0] = cval.real();
        } else {
            data.resize(2);
            data[0] = cval.real();
            data[1] = cval.imag();
        }
    }
}